

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSequence.hpp
# Opt level: O2

vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
* __thiscall
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::
readSequence<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
           *__return_storage_ptr__,ContinuumEnergyAngle *this,long lang,long nep,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  LegendreCoefficients local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
  ::reserve(__return_storage_ptr__,lang);
  if (this == (ContinuumEnergyAngle *)0x1) {
    while (bVar2 = lang != 0, lang = lang + -1, bVar2) {
      LegendreCoefficients::
      LegendreCoefficients<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&local_78,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)nep,begin,(long *)end,(int)lineNumber,MAT,MF);
      std::
      vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
      ::emplace_back<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>
                (__return_storage_ptr__,&local_78);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&local_78.super_Base.super_ListRecord.data.
                  super__Vector_base<double,_std::allocator<double>_>);
    }
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  tools::Log::info<char_const*>
            ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  tools::Log::info<char_const*,long>("LANG value: {}",(long)this);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< LegendreCoefficients >
readSequence( long lang,
              long nep,
              Iterator& begin,
              const Iterator& end,
              long& lineNumber,
              int MAT,
              int MF,
              int MT ) {

  std::vector< LegendreCoefficients > sequence;
  sequence.reserve( nep );

  if ( lang != 1 ) {

    Log::error( "Encountered illegal LANG value" );
    Log::info( "LANG must be equal to 1 for LAW=1" );
    Log::info( "LANG value: {}", lang );
    throw std::exception();
  }

  while( nep-- ) {

    sequence.emplace_back(
        LegendreCoefficients( begin, end, lineNumber, MAT, MF, MT ) );
  }

  return sequence;
}